

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_net.cpp
# Opt level: O0

void Net_ClearBuffers(void)

{
  int local_10;
  int local_c;
  int j;
  int i;
  
  memset(localcmds,0,0xe10);
  memset(netcmds,0,0x1680);
  memset(nettics,0,0x20);
  memset(nodeingame,0,8);
  memset(nodeforplayer,0,0x20);
  memset(playerfornode,0,0x20);
  memset(remoteresend,0,8);
  memset(resendto,0,0x20);
  memset(resendcount,0,0x20);
  memset(lastrecvtime,0,0x20);
  memset(currrecvtime,0,0x20);
  memset(consistancy,0,0x240);
  nodeingame[0] = true;
  for (local_c = 0; local_c < 8; local_c = local_c + 1) {
    for (local_10 = 0; local_10 < 0x24; local_10 = local_10 + 1) {
      FDynamicBuffer::SetData(NetSpecs[local_c] + local_10,(BYTE *)0x0,0);
    }
  }
  oldentertics = entertic;
  gametic = 0;
  maketic = 0;
  lastglobalrecvtime = 0;
  return;
}

Assistant:

void Net_ClearBuffers ()
{
	int i, j;

	memset (localcmds, 0, sizeof(localcmds));
	memset (netcmds, 0, sizeof(netcmds));
	memset (nettics, 0, sizeof(nettics));
	memset (nodeingame, 0, sizeof(nodeingame));
	memset (nodeforplayer, 0, sizeof(nodeforplayer));
	memset (playerfornode, 0, sizeof(playerfornode));
	memset (remoteresend, 0, sizeof(remoteresend));
	memset (resendto, 0, sizeof(resendto));
	memset (resendcount, 0, sizeof(resendcount));
	memset (lastrecvtime, 0, sizeof(lastrecvtime));
	memset (currrecvtime, 0, sizeof(currrecvtime));
	memset (consistancy, 0, sizeof(consistancy));
	nodeingame[0] = true;

	for (i = 0; i < MAXPLAYERS; i++)
	{
		for (j = 0; j < BACKUPTICS; j++)
		{
			NetSpecs[i][j].SetData (NULL, 0);
		}
	}

	oldentertics = entertic;
	gametic = 0;
	maketic = 0;

	lastglobalrecvtime = 0;
}